

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::BuiltinSerializer<std::forward_list<int,_std::allocator<int>_>,_void>::
     serialize<OutputStream>(forward_list<int,_std::allocator<int>_> *s,OutputStream *ostream)

{
  undefined4 uVar1;
  difference_type dVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  uint32_t size32;
  difference_type size;
  OutputStream *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  dVar2 = sequence_size<std::forward_list<int,std::allocator<int>>>
                    ((forward_list<int,_std::allocator<int>_> *)0x17ba98);
  uVar1 = (undefined4)dVar2;
  serialize<unsigned_int,OutputStream>
            ((uint *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  serialize_elems<OutputStream>(in_RDI,uVar1,in_RSI);
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }